

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarBinds.h
# Opt level: O2

void __thiscall
VarBind::VarBind(VarBind *this,SortableOIDType *oid,shared_ptr<BER_CONTAINER> *value)

{
  OIDType::cloneOID((OIDType *)this);
  this->type = ((value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
               _type;
  Catch::clara::std::__shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->value).super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>,
             &value->super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>);
  this->errorStatus = NO_ERROR;
  return;
}

Assistant:

VarBind(const SortableOIDType* oid, const std::shared_ptr<BER_CONTAINER>& value): oid(oid->cloneOID()), type(value->_type), value(value){}